

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_rwkv_wkv6::build_graph(test_rwkv_wkv6 *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_type gVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ggml_tensor *pgVar16;
  long lVar17;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  initializer_list<long> __l_04;
  allocator_type local_71;
  vector<long,_std::allocator<long>_> local_70;
  undefined1 local_58 [16];
  long local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar17 = this->n_seqs * this->n_seq_tokens;
  gVar11 = this->type;
  uVar1 = this->head_count;
  uVar6 = this->head_size;
  local_58._8_4_ = (int)uVar1;
  local_58._0_8_ = uVar6;
  local_58._12_4_ = (int)((ulong)uVar1 >> 0x20);
  __l._M_len = 3;
  __l._M_array = (iterator)local_58;
  local_48 = lVar17;
  std::vector<long,_std::allocator<long>_>::vector(&local_70,__l,&local_71);
  uVar12 = ggml_new_tensor(ctx,gVar11,3,
                           local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar11 = this->type;
  uVar2 = this->head_count;
  uVar7 = this->head_size;
  local_58._8_4_ = (int)uVar2;
  local_58._0_8_ = uVar7;
  local_58._12_4_ = (int)((ulong)uVar2 >> 0x20);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_58;
  local_48 = lVar17;
  std::vector<long,_std::allocator<long>_>::vector(&local_70,__l_00,&local_71);
  uVar13 = ggml_new_tensor(ctx,gVar11,3,
                           local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar11 = this->type;
  uVar3 = this->head_count;
  uVar8 = this->head_size;
  local_58._8_4_ = (int)uVar3;
  local_58._0_8_ = uVar8;
  local_58._12_4_ = (int)((ulong)uVar3 >> 0x20);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_58;
  local_48 = lVar17;
  std::vector<long,_std::allocator<long>_>::vector(&local_70,__l_01,&local_71);
  uVar14 = ggml_new_tensor(ctx,gVar11,3,
                           local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  local_38 = uVar14;
  if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar11 = this->type;
  uVar4 = this->head_count;
  uVar9 = this->head_size;
  local_58._8_4_ = (int)uVar4;
  local_58._0_8_ = uVar9;
  local_58._12_4_ = (int)((ulong)uVar4 >> 0x20);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_58;
  std::vector<long,_std::allocator<long>_>::vector(&local_70,__l_02,&local_71);
  local_40 = uVar13;
  uVar13 = ggml_new_tensor(ctx,gVar11,2,
                           local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar11 = this->type;
  uVar5 = this->head_count;
  uVar10 = this->head_size;
  local_58._8_4_ = (int)uVar5;
  local_58._0_8_ = uVar10;
  local_58._12_4_ = (int)((ulong)uVar5 >> 0x20);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_58;
  local_48 = lVar17;
  std::vector<long,_std::allocator<long>_>::vector(&local_70,__l_03,&local_71);
  uVar14 = ggml_new_tensor(ctx,gVar11,3,
                           local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gVar11 = this->type;
  local_58._8_8_ = this->n_seqs;
  local_58._0_8_ = this->head_size * this->head_size * this->head_count;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_58;
  std::vector<long,_std::allocator<long>_>::vector(&local_70,__l_04,&local_71);
  uVar15 = ggml_new_tensor(ctx,gVar11,2,
                           local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
  test_case::add_sentinel(&this->super_test_case,ctx);
  if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pgVar16 = (ggml_tensor *)ggml_rwkv_wkv6(ctx,local_40,local_38,uVar12,uVar13,uVar14,uVar15);
  return pgVar16;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t n_tokens = n_seq_tokens * n_seqs;
        ggml_tensor * r   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * k   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * v   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * tf  = ggml_new_tensor(ctx, type, 2, std::vector<int64_t>{ head_size, head_count }.data());
        ggml_tensor * td  = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * s   = ggml_new_tensor(ctx, type, 2, std::vector<int64_t>{ head_size * head_size * head_count, n_seqs }.data());
        ggml_tensor * out = ggml_rwkv_wkv6(ctx, k, v, r, tf, td, s);
        return out;
    }